

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

size_t wasm::ThreadPool::getNumCores(void)

{
  long *__nptr;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  long lVar4;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  allocator<char> local_31;
  
  iVar1 = std::thread::hardware_concurrency();
  pcVar2 = getenv("BINARYEN_CORES");
  if (pcVar2 == (char *)0x0) {
    return (ulong)(iVar1 + (uint)(iVar1 == 0));
  }
  pcVar2 = getenv("BINARYEN_CORES");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,pcVar2,&local_31);
  __nptr = local_60[0];
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol((char *)__nptr,(char **)&local_40,10);
  if (local_40 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    return (long)(int)lVar4;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

size_t ThreadPool::getNumCores() {
#if defined(__EMSCRIPTEN__) && !defined(__EMSCRIPTEN_PTHREADS__)
  // In an Emscripten build without pthreads support, avoid the overhead of
  // including support code for the below runtime checks.
  return 1;
#else
  size_t num = std::max(1U, std::thread::hardware_concurrency());
  if (getenv("BINARYEN_CORES")) {
    num = std::stoi(getenv("BINARYEN_CORES"));
  }
  return num;
#endif
}